

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O1

void SendAbort(void)

{
  uint uVar1;
  long lVar2;
  BYTE dis [2];
  undefined1 local_32 [2];
  
  if (1 < doomcom.numnodes) {
    if (consoleplayer == 0) {
      if (1 < doomcom.numnodes) {
        lVar2 = 1;
        do {
          uVar1 = 5;
          do {
            sendto(mysocket,local_32,2,0,(sockaddr *)(sendaddress + lVar2),0x10);
            uVar1 = uVar1 - 1;
          } while (1 < uVar1);
          lVar2 = lVar2 + 1;
        } while (lVar2 < doomcom.numnodes);
      }
    }
    else {
      uVar1 = 5;
      do {
        sendto(mysocket,local_32,2,0,(sockaddr *)(sendaddress + 1),0x10);
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
    }
  }
  return;
}

Assistant:

void SendAbort (void)
{
	BYTE dis[2] = { PRE_FAKE, PRE_DISCONNECT };
	int i, j;

	if (doomcom.numnodes > 1)
	{
		if (consoleplayer == 0)
		{
			// The host needs to let everyone know
			for (i = 1; i < doomcom.numnodes; ++i)
			{
				for (j = 4; j > 0; --j)
				{
					PreSend (dis, 2, &sendaddress[i]);
				}
			}
		}
		else
		{
			// Guests only need to let the host know.
			for (i = 4; i > 0; --i)
			{
				PreSend (dis, 2, &sendaddress[1]);
			}
		}
	}
}